

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O1

void __thiscall ram::MinimizerEngine::Filter(MinimizerEngine *this,double frequency)

{
  pointer pIVar1;
  uint32_t uVar2;
  ulong uVar3;
  invalid_argument *this_00;
  long lVar4;
  _Hash_node_base *p_Var5;
  Index *it;
  pointer pIVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> occurrences;
  uint local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  double local_48;
  undefined8 uStack_40;
  
  if ((frequency < 0.0) || (1.0 < frequency)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[ram::MinimizerEngine::Filter] error: invalid frequency");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((frequency != 0.0) || (NAN(frequency))) {
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    pIVar6 = (this->index_).
             super__Vector_base<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (this->index_).
             super__Vector_base<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = frequency;
    if (pIVar6 != pIVar1) {
      do {
        for (p_Var5 = (pIVar6->locator)._M_h._M_before_begin._M_nxt;
            p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
          if (((ulong)p_Var5[1]._M_nxt & 1) == 0) {
            local_6c = *(uint *)&p_Var5[2]._M_nxt;
            if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_68,
                         (iterator)
                         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_6c);
            }
            else {
              *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_6c;
LAB_0010b17e:
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            local_6c = 1;
            if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 1;
              goto LAB_0010b17e;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(int *)&local_6c);
          }
        }
        pIVar6 = pIVar6 + 1;
      } while (pIVar6 != pIVar1);
    }
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar2 = 0xffffffff;
    }
    else {
      local_48 = 1.0 - local_48;
      uVar3 = (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      auVar8._8_4_ = (int)((long)local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x22);
      auVar8._0_8_ = uVar3;
      auVar8._12_4_ = 0x45300000;
      uStack_40 = 0;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start +
          (long)(((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * local_48) !=
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar4 = 0x3f;
        if (uVar3 != 0) {
          for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introselect<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  ();
      }
      lVar4 = (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      auVar9._8_4_ = (int)((long)local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x22);
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = 0x45300000;
      dVar7 = local_48 *
              ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      uVar3 = (ulong)dVar7;
      uVar2 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3] + 1;
    }
    this->occurrence_ = uVar2;
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    this->occurrence_ = 0xffffffff;
  }
  return;
}

Assistant:

void MinimizerEngine::Filter(double frequency) {
  if (!(0 <= frequency && frequency <= 1)) {
    throw std::invalid_argument(
        "[ram::MinimizerEngine::Filter] error: invalid frequency");
  }

  if (frequency == 0) {
    occurrence_ = -1;
    return;
  }

  std::vector<std::uint32_t> occurrences;
  for (const auto& it : index_) {
    for (const auto& jt : it.locator) {
      if (jt.first & 1) {
        occurrences.emplace_back(1);
      } else {
        occurrences.emplace_back(static_cast<std::uint32_t>(jt.second));
      }
    }
  }

  if (occurrences.empty()) {
    occurrence_ = -1;
    return;
  }

  std::nth_element(
      occurrences.begin(),
      occurrences.begin() + (1 - frequency) * occurrences.size(),
      occurrences.end());
  occurrence_ = occurrences[(1 - frequency) * occurrences.size()] + 1;
}